

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

base_learner * cb_explore_adf_setup(options_i *options,vw *all)

{
  float fVar1;
  parser *ppVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  undefined *puVar9;
  vw *pvVar10;
  long *plVar11;
  byte bVar12;
  int iVar13;
  pointer pcVar14;
  ostream *poVar15;
  multi_learner *this;
  typed_option<float> *this_00;
  vw *in_RSI;
  long *in_RDI;
  learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  multi_learner *base;
  size_t problem_multiplier;
  option_group_definition new_options;
  string type_string;
  bool regcb;
  bool softmax;
  bool cb_explore_adf_option;
  free_ptr<CB_EXPLORE_ADF::cb_explore_adf> data;
  undefined4 in_stack_ffffffffffffde08;
  prediction_type_t in_stack_ffffffffffffde0c;
  vw *in_stack_ffffffffffffde10;
  string *in_stack_ffffffffffffde18;
  _func_void_cb_explore_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
  *predict;
  typed_option<float> *in_stack_ffffffffffffde20;
  single_learner *base_00;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffde58;
  option_group_definition *in_stack_ffffffffffffde60;
  allocator *paVar16;
  byte local_213a;
  byte local_2122;
  allocator *l_00;
  allocator local_1d89;
  string local_1d88 [39];
  allocator local_1d61;
  string local_1d60 [39];
  allocator local_1d39;
  string local_1d38 [39];
  allocator local_1d11;
  string local_1d10 [39];
  allocator local_1ce9;
  string local_1ce8 [37];
  byte local_1cc3;
  byte local_1cc2;
  allocator local_1cc1;
  string local_1cc0 [39];
  allocator local_1c99;
  string local_1c98 [39];
  allocator local_1c71;
  string local_1c70 [39];
  allocator local_1c49;
  string local_1c48 [32];
  size_t local_1c28;
  allocator local_1c19;
  string local_1c18 [39];
  allocator local_1bf1;
  string local_1bf0 [39];
  allocator local_1bc9;
  string local_1bc8 [39];
  allocator local_1ba1;
  string local_1ba0 [39];
  allocator local_1b79;
  string local_1b78 [32];
  undefined4 local_1b58;
  allocator local_1b51;
  string local_1b50 [39];
  allocator local_1b29;
  string local_1b28 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b08 [2];
  allocator local_19c1;
  string local_19c0 [39];
  allocator local_1999;
  string local_1998 [32];
  typed_option<float> local_1978 [2];
  allocator local_1831;
  string local_1830 [39];
  allocator local_1809;
  string local_1808 [32];
  typed_option<bool> local_17e8 [2];
  allocator local_16a1;
  string local_16a0 [39];
  allocator local_1679;
  string local_1678 [32];
  typed_option<float> local_1658 [2];
  allocator local_1511;
  string local_1510 [39];
  allocator local_14e9;
  string local_14e8 [32];
  typed_option<float> local_14c8 [2];
  allocator local_1381;
  string local_1380 [39];
  allocator local_1359;
  string local_1358 [32];
  typed_option<bool> local_1338 [2];
  allocator local_11f1;
  string local_11f0 [39];
  allocator local_11c9;
  string local_11c8 [32];
  typed_option<float> local_11a8 [2];
  allocator local_1061;
  string local_1060 [39];
  allocator local_1039;
  string local_1038 [32];
  typed_option<bool> local_1018 [2];
  allocator local_ed1;
  string local_ed0 [39];
  allocator local_ea9;
  string local_ea8 [32];
  typed_option<bool> local_e88 [2];
  allocator local_d41;
  string local_d40 [39];
  allocator local_d19;
  string local_d18 [32];
  typed_option<bool> local_cf8 [2];
  allocator local_bb1;
  string local_bb0 [39];
  allocator local_b89;
  string local_b88 [32];
  typed_option<bool> local_b68 [2];
  allocator local_a21;
  string local_a20 [39];
  allocator local_9f9;
  string local_9f8 [32];
  typed_option<float> local_9d8 [2];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [32];
  typed_option<unsigned_long> local_848 [2];
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [32];
  typed_option<unsigned_long> local_6b8 [2];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [32];
  typed_option<float> local_528 [2];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  typed_option<unsigned_long> local_398 [2];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  typed_option<bool> local_208 [2];
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [79];
  allocator local_51;
  string local_50 [37];
  byte local_2b;
  byte local_2a;
  byte local_29;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<CB_EXPLORE_ADF::cb_explore_adf>();
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"ips",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"Contextual Bandit Exploration with Action Dependent Features",&local_c1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"cb_explore_adf",&local_229);
  VW::config::make_option<bool>(in_stack_ffffffffffffde18,(bool *)in_stack_ffffffffffffde10);
  VW::config::typed_option<bool>::keep(local_208,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_250,
             "Online explore-exploit for a contextual bandit problem with multiline action dependent features"
             ,&local_251);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffde60,(typed_option<bool> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"first",&local_3b9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32d656);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffde18,(unsigned_long *)in_stack_ffffffffffffde10);
  VW::config::typed_option<unsigned_long>::keep(local_398,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"tau-first exploration",&local_3e1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffde60,(typed_option<unsigned_long> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"epsilon",&local_549);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32d758);
  VW::config::make_option<float>(in_stack_ffffffffffffde18,(float *)in_stack_ffffffffffffde10);
  VW::config::typed_option<float>::keep(local_528,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"epsilon-greedy exploration",&local_571);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffde60,(typed_option<float> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"bag",&local_6d9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32d85a);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffde18,(unsigned_long *)in_stack_ffffffffffffde10);
  VW::config::typed_option<unsigned_long>::keep(local_6b8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"bagging-based exploration",&local_701);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffde60,(typed_option<unsigned_long> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"cover",&local_869);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32d95c);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffde18,(unsigned_long *)in_stack_ffffffffffffde10);
  VW::config::typed_option<unsigned_long>::keep(local_848,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"Online cover based exploration",&local_891);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffde60,(typed_option<unsigned_long> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f8,"psi",&local_9f9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32da5e);
  VW::config::make_option<float>(in_stack_ffffffffffffde18,(float *)in_stack_ffffffffffffde10);
  VW::config::typed_option<float>::keep(local_9d8,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffde20,(float)((ulong)in_stack_ffffffffffffde18 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a20,"disagreement parameter for cover",&local_a21);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffde60,(typed_option<float> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"nounif",&local_b89);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32db7f);
  VW::config::make_option<bool>(in_stack_ffffffffffffde18,(bool *)in_stack_ffffffffffffde10);
  VW::config::typed_option<bool>::keep(local_b68,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_bb0,"do not explore uniformly on zero-probability actions in cover",&local_bb1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffde60,(typed_option<bool> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d18,"softmax",&local_d19);
  VW::config::make_option<bool>(in_stack_ffffffffffffde18,(bool *)in_stack_ffffffffffffde10);
  VW::config::typed_option<bool>::keep(local_cf8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d40,"softmax exploration",&local_d41);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffde60,(typed_option<bool> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea8,"regcb",&local_ea9);
  VW::config::make_option<bool>(in_stack_ffffffffffffde18,(bool *)in_stack_ffffffffffffde10);
  VW::config::typed_option<bool>::keep(local_e88,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ed0,"RegCB-elim exploration",&local_ed1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffde60,(typed_option<bool> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1038,"regcbopt",&local_1039);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32de6d);
  VW::config::make_option<bool>(in_stack_ffffffffffffde18,(bool *)in_stack_ffffffffffffde10);
  VW::config::typed_option<bool>::keep(local_1018,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1060,"RegCB optimistic exploration",&local_1061);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffde60,(typed_option<bool> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c8,"mellowness",&local_11c9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32df72);
  VW::config::make_option<float>(in_stack_ffffffffffffde18,(float *)in_stack_ffffffffffffde10);
  VW::config::typed_option<float>::keep(local_11a8,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffde20,(float)((ulong)in_stack_ffffffffffffde18 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11f0,"RegCB mellowness parameter c_0. Default 0.1",&local_11f1)
  ;
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffde60,(typed_option<float> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1358,"greedify",&local_1359);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32e096);
  VW::config::make_option<bool>(in_stack_ffffffffffffde18,(bool *)in_stack_ffffffffffffde10);
  VW::config::typed_option<bool>::keep(local_1338,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1380,"always update first policy once in bagging",&local_1381);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffde60,(typed_option<bool> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14e8,"cb_min_cost",&local_14e9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32e19b);
  VW::config::make_option<float>(in_stack_ffffffffffffde18,(float *)in_stack_ffffffffffffde10);
  VW::config::typed_option<float>::keep(local_14c8,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffde20,(float)((ulong)in_stack_ffffffffffffde18 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1510,"lower bound on cost",&local_1511);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffde60,(typed_option<float> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1678,"cb_max_cost",&local_1679);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32e2ba);
  VW::config::make_option<float>(in_stack_ffffffffffffde18,(float *)in_stack_ffffffffffffde10);
  VW::config::typed_option<float>::keep(local_1658,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffde20,(float)((ulong)in_stack_ffffffffffffde18 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16a0,"upper bound on cost",&local_16a1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffde60,(typed_option<float> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1808,"first_only",&local_1809);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32e3de);
  VW::config::make_option<bool>(in_stack_ffffffffffffde18,(bool *)in_stack_ffffffffffffde10);
  VW::config::typed_option<bool>::keep(local_17e8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1830,"Only explore the first action in a tie-breaking event",&local_1831);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffde10,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffde60,(typed_option<bool> *)in_stack_ffffffffffffde58);
  l_00 = &local_1999;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1998,"lambda",l_00);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32e4e3);
  VW::config::make_option<float>(in_stack_ffffffffffffde18,(float *)in_stack_ffffffffffffde10);
  VW::config::typed_option<float>::keep(local_1978,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffde20,(float)((ulong)in_stack_ffffffffffffde18 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19c0,"parameter for softmax",&local_19c1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffde10,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffde60,(typed_option<float> *)in_stack_ffffffffffffde58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b28,"cb_type",&local_1b29);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffde18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde10);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_1b08,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b50,"contextual bandit method to use in {ips,dm,dr}",&local_1b51);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffde10,
       (string *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffde10,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffde60,in_stack_ffffffffffffde58);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b51);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b29);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_19c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19c1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1998);
  std::allocator<char>::~allocator((allocator<char> *)&local_1999);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1830);
  std::allocator<char>::~allocator((allocator<char> *)&local_1831);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1808);
  std::allocator<char>::~allocator((allocator<char> *)&local_1809);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_16a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16a1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1678);
  std::allocator<char>::~allocator((allocator<char> *)&local_1679);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1510);
  std::allocator<char>::~allocator((allocator<char> *)&local_1511);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_14e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1380);
  std::allocator<char>::~allocator((allocator<char> *)&local_1381);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1358);
  std::allocator<char>::~allocator((allocator<char> *)&local_1359);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_11f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_11c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1060);
  std::allocator<char>::~allocator((allocator<char> *)&local_1061);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_ed0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_ea8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_d40);
  std::allocator<char>::~allocator((allocator<char> *)&local_d41);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_a21);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  (**(code **)*local_10)(local_10,local_a0);
  plVar11 = local_10;
  if ((local_29 & 1) == 0) {
    local_8 = (vw *)0x0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b78,"cb_type",&local_1b79);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1b78);
    std::__cxx11::string::~string(local_1b78);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b79);
    plVar11 = local_10;
    if (((bVar12 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1ba0,"cb_type",&local_1ba1);
      (**(code **)(*plVar11 + 0x28))(plVar11,local_1ba0,local_50);
      std::__cxx11::string::~string(local_1ba0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ba1);
      (**(code **)*local_10)(local_10,local_a0);
    }
    pvVar10 = local_18;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32fdb4);
    pcVar14->all = pvVar10;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32fdd0);
    if (0.0 < pcVar14->lambda) {
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32fded)
      ;
      fVar1 = pcVar14->lambda;
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x32fe18)
      ;
      pcVar14->lambda = -fVar1;
    }
    plVar11 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1bc8,"cb_adf",&local_1bc9);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1bc8);
    std::__cxx11::string::~string(local_1bc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1bc9);
    plVar11 = local_10;
    if (((bVar12 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1bf0,"cb_adf",&local_1bf1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c18,"",&local_1c19);
      (**(code **)(*plVar11 + 0x28))(plVar11,local_1bf0,local_1c18);
      std::__cxx11::string::~string(local_1c18);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c19);
      std::__cxx11::string::~string(local_1bf0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1bf1);
    }
    plVar11 = local_10;
    local_18->delete_prediction = ACTION_SCORE::delete_action_scores;
    local_1c28 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c48,"cover",&local_1c49);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1c48);
    std::__cxx11::string::~string(local_1c48);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c49);
    plVar11 = local_10;
    if ((bVar12 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c70,"bag",&local_1c71);
      bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1c70);
      std::__cxx11::string::~string(local_1c70);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c71);
      plVar11 = local_10;
      if ((bVar12 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c98,"first",&local_1c99);
        bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1c98);
        std::__cxx11::string::~string(local_1c98);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c99);
        plVar11 = local_10;
        if ((bVar12 & 1) == 0) {
          if ((local_2a & 1) == 0) {
            local_1cc2 = 0;
            local_1cc3 = 0;
            local_2122 = 1;
            if ((local_2b & 1) == 0) {
              std::allocator<char>::allocator();
              local_1cc2 = 1;
              std::__cxx11::string::string(local_1cc0,"regcbopt",&local_1cc1);
              local_1cc3 = 1;
              bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1cc0);
              local_213a = 0;
              if ((bVar12 & 1) != 0) {
                pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                          operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *
                                     )0x33046a);
                local_213a = pcVar14->regcbopt;
              }
              local_2122 = local_213a;
            }
            if ((local_1cc3 & 1) != 0) {
              std::__cxx11::string::~string(local_1cc0);
            }
            if ((local_1cc2 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_1cc1);
            }
            plVar11 = local_10;
            if ((local_2122 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1ce8,"epsilon",&local_1ce9);
              bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1ce8);
              std::__cxx11::string::~string(local_1ce8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1ce9);
              if (((bVar12 ^ 0xff) & 1) != 0) {
                pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                          operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *
                                     )0x3305f8);
                pcVar14->epsilon = 0.05;
              }
              pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                        operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                   0x33065d);
              pcVar14->explore_type = 1;
            }
            else {
              pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                        operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                   0x3304df);
              pcVar14->explore_type = 5;
            }
          }
          else {
            pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                                ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                 0x33039b);
            pcVar14->explore_type = 3;
          }
        }
        else {
          pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                               0x33032e);
          pcVar14->explore_type = 0;
        }
      }
      else {
        pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                             0x330226);
        pcVar14->explore_type = 2;
        pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                             0x33023b);
        local_1c28 = pcVar14->bag_size;
      }
    }
    else {
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x33011a)
      ;
      pcVar14->explore_type = 4;
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x33012f)
      ;
      local_1c28 = pcVar14->cover_size + 1;
    }
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x33067a);
    plVar11 = local_10;
    (pcVar14->gen_cs).cb_type = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d10,"cb_type",&local_1d11);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1d10);
    std::__cxx11::string::~string(local_1d10);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d11);
    if ((bVar12 & 1) != 0) {
      iVar13 = std::__cxx11::string::compare((char *)local_50);
      if (iVar13 == 0) {
        pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                             0x33073a);
        (pcVar14->gen_cs).cb_type = 0;
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)local_50);
        if (iVar13 == 0) {
          pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                               0x3307b9);
          (pcVar14->gen_cs).cb_type = 2;
        }
        else {
          iVar13 = std::__cxx11::string::compare((char *)local_50);
          if (iVar13 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d38,"cover",&local_1d39);
            bVar12 = (**(code **)(*local_10 + 8))(local_10,local_1d38);
            std::__cxx11::string::~string(local_1d38);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d39);
            if ((bVar12 & 1) != 0) {
              poVar15 = std::operator<<(&(local_18->trace_message).super_ostream,
                                        "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                                       );
              std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
            }
            pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                                ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                 0x3308f6);
            (pcVar14->gen_cs).cb_type = 3;
          }
          else {
            poVar15 = std::operator<<(&(local_18->trace_message).super_ostream,
                                      "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\'}; resetting to ips."
                                     );
            std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
            paVar16 = &local_1d61;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d60,"cb_type",paVar16);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d88,"ips",&local_1d89);
            (**(code **)(*local_10 + 0x30))(local_10,local_1d60,local_1d88);
            std::__cxx11::string::~string(local_1d88);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d89);
            std::__cxx11::string::~string(local_1d60);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d61);
          }
        }
      }
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x330a82)
      ;
      if ((pcVar14->explore_type == 5) &&
         (pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                               0x330a96), (pcVar14->gen_cs).cb_type != 3)) {
        poVar15 = std::operator<<(&(local_18->trace_message).super_ostream,
                                  "warning: bad cb_type, RegCB only supports mtr!");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
    }
    setup_base((options_i *)in_stack_ffffffffffffde18,in_stack_ffffffffffffde10);
    LEARNER::as_multiline<char,char>((learner<char,_char> *)l_00);
    ppVar2 = local_18->p;
    (ppVar2->lp).label_size = DAT_00478d48;
    puVar9 = PTR_test_label_00478d40;
    puVar8 = PTR_weight_00478d30;
    puVar7 = PTR_delete_label_00478d28;
    puVar6 = PTR_read_cached_label_00478d20;
    puVar5 = PTR_cache_label_00478d18;
    puVar4 = PTR_parse_label_00478d10;
    puVar3 = CB::cb_label;
    (ppVar2->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_00478d38;
    (ppVar2->lp).test_label = (_func_bool_void_ptr *)puVar9;
    (ppVar2->lp).delete_label = (_func_void_void_ptr *)puVar7;
    (ppVar2->lp).get_weight = (_func_float_void_ptr *)puVar8;
    (ppVar2->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar5;
    (ppVar2->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar6;
    (ppVar2->lp).default_label = (_func_void_void_ptr *)puVar3;
    (ppVar2->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar4;
    local_18->label_type = cb;
    base_00 = local_18->scorer;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x330b8c);
    (pcVar14->gen_cs).scorer = base_00;
    this = LEARNER::as_multiline<char,char>((learner<char,_char> *)l_00);
    predict = (_func_void_cb_explore_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
               *)local_28;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x330bc2);
    pcVar14->cs_ldf_learner = this;
    this_00 = (typed_option<float> *)
              LEARNER::
              init_learner<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                        ((free_ptr<CB_EXPLORE_ADF::cb_explore_adf> *)this,
                         (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                         base_00,(_func_void_cb_explore_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                  *)in_stack_ffffffffffffde20,predict,
                         (size_t)in_stack_ffffffffffffde10,in_stack_ffffffffffffde0c);
    in_stack_ffffffffffffde20 = this_00;
    LEARNER::
    learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish_example((learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)this_00,CB_EXPLORE_ADF::finish_multiline_example);
    LEARNER::
    learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish((learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
                *)this,(_func_void_cb_explore_adf_ptr *)base_00);
    in_stack_ffffffffffffde10 =
         (vw *)LEARNER::
               make_base<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>>
                         ((learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
                           *)this_00);
    local_8 = in_stack_ffffffffffffde10;
  }
  local_1b58 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffde10);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
             in_stack_ffffffffffffde20);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cb_explore_adf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore_adf>();
  bool cb_explore_adf_option = false;
  bool softmax = false;
  bool regcb = false;
  std::string type_string = "ips";
  option_group_definition new_options("Contextual Bandit Exploration with Action Dependent Features");
  new_options
      .add(make_option("cb_explore_adf", cb_explore_adf_option)
               .keep()
               .help("Online explore-exploit for a contextual bandit problem with multiline action dependent features"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"))
      .add(make_option("nounif", data->nounif)
               .keep()
               .help("do not explore uniformly on zero-probability actions in cover"))
      .add(make_option("softmax", softmax).keep().help("softmax exploration"))
      .add(make_option("regcb", regcb).keep().help("RegCB-elim exploration"))
      .add(make_option("regcbopt", data->regcbopt).keep().help("RegCB optimistic exploration"))
      .add(make_option("mellowness", data->c0)
               .keep()
               .default_value(0.1f)
               .help("RegCB mellowness parameter c_0. Default 0.1"))
      .add(make_option("greedify", data->greedify).keep().help("always update first policy once in bagging"))
      .add(make_option("cb_min_cost", data->min_cb_cost).keep().default_value(0.f).help("lower bound on cost"))
      .add(make_option("cb_max_cost", data->max_cb_cost).keep().default_value(1.f).help("upper bound on cost"))
      .add(make_option("first_only", data->first_only)
               .keep()
               .help("Only explore the first action in a tie-breaking event"))
      .add(make_option("lambda", data->lambda).keep().default_value(-1.f).help("parameter for softmax"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr}"));
  options.add_and_parse(new_options);

  if (!cb_explore_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  data->all = &all;
  if (data->lambda > 0)  // Lambda should always be negative because we are using a cost basis.
    data->lambda = -data->lambda;

  if (!options.was_supplied("cb_adf"))
  {
    options.insert("cb_adf", "");
  }

  all.delete_prediction = delete_action_scores;

  size_t problem_multiplier = 1;

  if (options.was_supplied("cover"))
  {
    data->explore_type = COVER;
    problem_multiplier = data->cover_size + 1;
  }
  else if (options.was_supplied("bag"))
  {
    data->explore_type = BAG_EXPLORE;
    problem_multiplier = data->bag_size;
  }
  else if (options.was_supplied("first"))
    data->explore_type = EXPLORE_FIRST;
  else if (softmax)
    data->explore_type = SOFTMAX;
  else if (regcb || (options.was_supplied("regcbopt") && data->regcbopt))
    data->explore_type = REGCB;
  else
  {
    if (!options.was_supplied("epsilon"))
      data->epsilon = 0.05f;
    data->explore_type = EPS_GREEDY;
  }

  data->gen_cs.cb_type = CB_TYPE_IPS;
  if (options.was_supplied("cb_type"))
  {
    if (type_string.compare("dr") == 0)
      data->gen_cs.cb_type = CB_TYPE_DR;
    else if (type_string.compare("ips") == 0)
      data->gen_cs.cb_type = CB_TYPE_IPS;
    else if (type_string.compare("mtr") == 0)
    {
      if (options.was_supplied("cover"))
        all.trace_message << "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                          << endl;
      data->gen_cs.cb_type = CB_TYPE_MTR;
    }
    else
    {
      all.trace_message << "warning: cb_type must be in {'ips','dr','mtr'}; resetting to ips." << std::endl;
      options.replace("cb_type", "ips");
    }

    if (data->explore_type == REGCB && data->gen_cs.cb_type != CB_TYPE_MTR)
      all.trace_message << "warning: bad cb_type, RegCB only supports mtr!" << std::endl;
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  // Extract from lower level reductions.
  data->gen_cs.scorer = all.scorer;
  data->cs_ldf_learner = as_multiline(all.cost_sensitive);

  learner<cb_explore_adf, multi_ex>& l = init_learner(data, base, CB_EXPLORE_ADF::do_actual_learning<true>,
      CB_EXPLORE_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_probs);

  l.set_finish_example(CB_EXPLORE_ADF::finish_multiline_example);
  l.set_finish(CB_EXPLORE_ADF::finish);
  return make_base(l);
}